

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pda.cpp
# Opt level: O3

void __thiscall Pda::createDot(Pda *this)

{
  pointer pcVar1;
  pointer ppTVar2;
  bool bVar3;
  string *psVar4;
  long *plVar5;
  pointer ppNVar6;
  vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_> *pvVar7;
  Node *pNVar8;
  Node *pNVar9;
  long *plVar10;
  size_type *psVar11;
  Node **ppNVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  pointer __args;
  char cVar14;
  Pda *this_00;
  pointer ppNVar15;
  pointer ppTVar16;
  string to_png;
  vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_> used;
  string e;
  string s;
  vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> ends;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string start;
  ofstream file;
  undefined1 local_380 [32];
  Pda *local_360;
  size_type *local_358;
  long local_350;
  size_type local_348;
  long lStack_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_> local_318;
  Node **local_300;
  long local_2f8;
  Node *local_2f0;
  long lStack_2e8;
  long *local_2e0;
  long local_2d8;
  long local_2d0;
  long lStack_2c8;
  long *local_2c0;
  long local_2b8;
  long local_2b0 [2];
  vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> local_2a0;
  long *local_288 [2];
  long local_278 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  pointer local_248;
  pointer local_240;
  pointer local_238;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(&local_230,"PDA.dot",_S_out);
  psVar4 = Tjen::Node::getName_abi_cxx11_(this->start);
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  pcVar1 = (psVar4->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_268,pcVar1,pcVar1 + psVar4->_M_string_length);
  local_2c0 = local_2b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2c0,"digraph {\nrankdir=LR \n","");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_380,
                 "invis -> ",&local_268);
  plVar5 = (long *)std::__cxx11::string::append(local_380);
  local_2e0 = &local_2d0;
  plVar10 = plVar5 + 2;
  if ((long *)*plVar5 == plVar10) {
    local_2d0 = *plVar10;
    lStack_2c8 = plVar5[3];
  }
  else {
    local_2d0 = *plVar10;
    local_2e0 = (long *)*plVar5;
  }
  local_2d8 = plVar5[1];
  *plVar5 = (long)plVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((Pda *)local_380._0_8_ != (Pda *)(local_380 + 0x10)) {
    operator_delete((void *)local_380._0_8_,local_380._16_8_ + 1);
  }
  std::__cxx11::string::append((char *)&local_2c0);
  std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::vector(&local_2a0,&this->endNodes);
  ppNVar15 = (this->allNodes).super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_248 = (this->allNodes).super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  if (ppNVar15 != local_248) {
    do {
      local_360 = (Pda *)*ppNVar15;
      for (ppNVar6 = local_2a0.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          ppNVar6 !=
          local_2a0.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>._M_impl.
          super__Vector_impl_data._M_finish; ppNVar6 = ppNVar6 + 1) {
        if ((Pda *)*ppNVar6 == local_360) {
          psVar4 = Tjen::Node::getName_abi_cxx11_((Node *)local_360);
          local_380._0_8_ = local_380 + 0x10;
          pcVar1 = (psVar4->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_380,pcVar1,pcVar1 + psVar4->_M_string_length);
          std::__cxx11::string::append((char *)local_380);
          std::__cxx11::string::_M_append((char *)&local_2c0,local_380._0_8_);
          if ((Pda *)local_380._0_8_ != (Pda *)(local_380 + 0x10)) {
            operator_delete((void *)local_380._0_8_,local_380._16_8_ + 1);
          }
          break;
        }
      }
      local_318.
      super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_318.
      super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (Transition **)0x0;
      local_318.
      super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (Transition **)0x0;
      this_00 = local_360;
      local_240 = ppNVar15;
      pvVar7 = Tjen::Node::getTransitions((Node *)local_360);
      __args = (pvVar7->
               super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_238 = (pvVar7->
                  super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      if (__args != local_238) {
        do {
          bVar3 = checkForTrans(this_00,&local_318,*__args);
          if (!bVar3) {
            local_380._0_8_ = local_380 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_380,"[label=\"","");
            pvVar7 = Tjen::Node::getTransitions((Node *)local_360);
            ppTVar2 = (pvVar7->
                      super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
            for (ppTVar16 = (pvVar7->
                            super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>
                            )._M_impl.super__Vector_impl_data._M_start; ppTVar16 != ppTVar2;
                ppTVar16 = ppTVar16 + 1) {
              pNVar8 = Tjen::Node::Transition::getTo(*__args);
              pNVar9 = Tjen::Node::Transition::getTo(*ppTVar16);
              if (pNVar8 == pNVar9) {
                Tjen::Node::Transition::getInput(*__args);
                cVar14 = (char)(string *)local_380;
                std::__cxx11::string::push_back(cVar14);
                std::__cxx11::string::append((char *)local_380);
                Tjen::Node::Transition::getOldStack(*__args);
                std::__cxx11::string::push_back(cVar14);
                psVar4 = Tjen::Node::Transition::getNewstack_abi_cxx11_(*__args);
                std::operator+(&local_338,"/",psVar4);
                plVar5 = (long *)std::__cxx11::string::append((char *)&local_338);
                psVar11 = (size_type *)(plVar5 + 2);
                if ((size_type *)*plVar5 == psVar11) {
                  local_348 = *psVar11;
                  lStack_340 = plVar5[3];
                  local_358 = &local_348;
                }
                else {
                  local_348 = *psVar11;
                  local_358 = (size_type *)*plVar5;
                }
                local_350 = plVar5[1];
                *plVar5 = (long)psVar11;
                plVar5[1] = 0;
                *(undefined1 *)(plVar5 + 2) = 0;
                std::__cxx11::string::_M_append((char *)local_380,(ulong)local_358);
                if (local_358 != &local_348) {
                  operator_delete(local_358,local_348 + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_338._M_dataplus._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)&local_338 + 0x10U)) {
                  operator_delete(local_338._M_dataplus._M_p,
                                  local_338.field_2._M_allocated_capacity + 1);
                }
              }
            }
            std::__cxx11::string::append((char *)local_380);
            psVar4 = Tjen::Node::getName_abi_cxx11_((Node *)local_360);
            pcVar1 = (psVar4->_M_dataplus)._M_p;
            local_288[0] = local_278;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_288,pcVar1,pcVar1 + psVar4->_M_string_length);
            std::__cxx11::string::append((char *)local_288);
            pNVar8 = Tjen::Node::Transition::getTo(*__args);
            psVar4 = Tjen::Node::getName_abi_cxx11_(pNVar8);
            plVar5 = (long *)std::__cxx11::string::_M_append
                                       ((char *)local_288,(ulong)(psVar4->_M_dataplus)._M_p);
            ppNVar12 = (Node **)(plVar5 + 2);
            if ((Node **)*plVar5 == ppNVar12) {
              local_2f0 = *ppNVar12;
              lStack_2e8 = plVar5[3];
              local_300 = &local_2f0;
            }
            else {
              local_2f0 = *ppNVar12;
              local_300 = (Node **)*plVar5;
            }
            local_2f8 = plVar5[1];
            *plVar5 = (long)ppNVar12;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_300,local_380._0_8_);
            paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 == paVar13) {
              local_338.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
              local_338.field_2._8_8_ = plVar5[3];
              local_338._M_dataplus._M_p = (pointer)((long)&local_338 + 0x10U);
            }
            else {
              local_338.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
              local_338._M_dataplus._M_p = (pointer)*plVar5;
            }
            local_338._M_string_length = plVar5[1];
            *plVar5 = (long)paVar13;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_338);
            psVar11 = (size_type *)(plVar5 + 2);
            if ((size_type *)*plVar5 == psVar11) {
              local_348 = *psVar11;
              lStack_340 = plVar5[3];
              local_358 = &local_348;
            }
            else {
              local_348 = *psVar11;
              local_358 = (size_type *)*plVar5;
            }
            local_350 = plVar5[1];
            *plVar5 = (long)psVar11;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_2e0,(ulong)local_358);
            if (local_358 != &local_348) {
              operator_delete(local_358,local_348 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_338._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)&local_338 + 0x10U)) {
              operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_300 != &local_2f0) {
              operator_delete(local_300,(ulong)((long)&(local_2f0->name)._M_dataplus._M_p + 1));
            }
            if (local_288[0] != local_278) {
              operator_delete(local_288[0],local_278[0] + 1);
            }
            if (local_318.
                super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_318.
                super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<Tjen::Node::Transition*,std::allocator<Tjen::Node::Transition*>>::
              _M_realloc_insert<Tjen::Node::Transition*const&>
                        ((vector<Tjen::Node::Transition*,std::allocator<Tjen::Node::Transition*>> *)
                         &local_318,
                         (iterator)
                         local_318.
                         super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish,__args);
            }
            else {
              *local_318.
               super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>
               ._M_impl.super__Vector_impl_data._M_finish = *__args;
              local_318.
              super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_318.
                   super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
            this_00 = (Pda *)local_380._0_8_;
            if ((Pda *)local_380._0_8_ != (Pda *)(local_380 + 0x10)) {
              operator_delete((void *)local_380._0_8_,local_380._16_8_ + 1);
            }
          }
          __args = __args + 1;
        } while (__args != local_238);
      }
      if (local_318.
          super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_318.
                        super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_318.
                              super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_318.
                              super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      ppNVar15 = local_240 + 1;
    } while (ppNVar15 != local_248);
  }
  local_380._0_8_ = local_380 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_380,local_2e0,local_2d8 + (long)local_2e0);
  std::__cxx11::string::append(local_380);
  std::__cxx11::string::_M_append((char *)&local_2c0,local_380._0_8_);
  if ((undefined1 *)local_380._0_8_ != local_380 + 0x10) {
    operator_delete((void *)local_380._0_8_,local_380._16_8_ + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,(char *)local_2c0,local_2b8);
  std::ofstream::close();
  local_380._0_8_ = local_380 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_380,"dot PDA.dot -Tpng -o PDA.png","");
  system("dot PDA.dot -Tpng -o PDA.png");
  if ((undefined1 *)local_380._0_8_ != local_380 + 0x10) {
    operator_delete((void *)local_380._0_8_,local_380._16_8_ + 1);
  }
  if (local_2a0.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2a0.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2a0.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a0.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2e0 != &local_2d0) {
    operator_delete(local_2e0,local_2d0 + 1);
  }
  if (local_2c0 != local_2b0) {
    operator_delete(local_2c0,local_2b0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void Pda::createDot() {

    //file aanmaak en init stuff
    std::ofstream file ("PDA.dot");
    std::string start = this->getStart()->getName();
    std::string s = "digraph {\nrankdir=LR \n";
    std::string e = "invis -> "+ start + " \n";
    s+= "invis [style=invisible] \n";

    //endstates dubbele rand geven
    std::vector<Tjen::Node*> ends = this->getEndNodes();
    for (Tjen::Node* node: this->getAllNodes()) {
        if(checkForNode(ends, node)){
            s+= node->getName() + " [shape=doublecircle] \n";
        }


        //transities toevoegen
        std::vector<Tjen::Node::Transition*> used;
        for (auto& t: node->getTransitions()) {
            if (!checkForTrans(used, t)) {
                std::string label = "[label=\"";
                for (auto &t2: node->getTransitions()) {
                    if (t->getTo() == t2->getTo()) {
                        label += t->getInput();
                        label += ", ";
                        label += t->getOldStack();
                        label += "/" + t->getNewstack() + "\\n";
                    }
                }
                label += "\"]";

                e += node->getName() + " -> " + t->getTo()->getName() + label + "\n";
                used.push_back(t);
            }
        }
    }

    s+=e +"}";
    file << s;
    file.close();

    //convergeer commando
    std::string to_png = "dot PDA.dot -Tpng -o PDA.png";
    system("dot PDA.dot -Tpng -o PDA.png");
}